

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ipv6.c
# Opt level: O3

int lrtr_ipv6_str_to_addr(char *a,lrtr_ipv6_addr *ip)

{
  byte bVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  byte *pbVar6;
  int iVar7;
  ulong uVar8;
  long in_FS_OFFSET;
  lrtr_ipv4_addr addr4;
  uint16_t words [8];
  lrtr_ipv4_addr local_3c;
  uint local_38 [4];
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  if (*a == ':') {
    iVar2 = -1;
    if (a[1] != ':') {
LAB_00103c77:
      if (*(long *)(in_FS_OFFSET + 0x28) != local_28) {
        __stack_chk_fail();
      }
      return iVar2;
    }
    a = a + 1;
  }
  iVar7 = -1;
  uVar8 = 0;
  pbVar6 = (byte *)a;
LAB_00103b03:
  while( true ) {
    pbVar6 = pbVar6 + 1;
    bVar1 = *a;
    if (bVar1 != 0x3a) {
      if (bVar1 != 0) {
        iVar3 = 0;
        uVar4 = 0;
        do {
          if ((byte)(bVar1 - 0x30) < 10) {
            uVar5 = (uint)(byte)(bVar1 - 0x30);
          }
          else if ((byte)(bVar1 + 0xbf) < 6) {
            uVar5 = bVar1 - 0x37;
          }
          else {
            if (5 < (byte)(bVar1 + 0x9f)) goto LAB_00103b88;
            uVar5 = bVar1 - 0x57;
          }
          iVar3 = iVar3 * 0x10 + uVar5;
          iVar2 = -1;
          if ((0xffff < iVar3) || (3 < uVar4)) goto LAB_00103c77;
          uVar4 = uVar4 + 1;
          bVar1 = *pbVar6;
          pbVar6 = pbVar6 + 1;
        } while( true );
      }
      goto LAB_00103c12;
    }
    if (-1 < iVar7) break;
    a = (char *)((byte *)a + 1);
    iVar7 = (int)uVar8;
  }
  iVar2 = -1;
  goto LAB_00103c77;
LAB_00103b88:
  iVar2 = -1;
  if (bVar1 == 0) {
    a = (char *)(pbVar6 + -1);
  }
  else {
    if (bVar1 != 0x3a) {
      if ((bVar1 == 0x2e) &&
         (((uVar8 == 6 || (-1 < iVar7 && uVar8 < 6)) &&
          (iVar3 = lrtr_ipv4_str_to_addr(a,&local_3c), iVar3 != -1)))) {
        *(uint32_t *)((long)local_38 + uVar8 * 2) = local_3c.addr >> 0x10 | local_3c.addr << 0x10;
        uVar8 = (ulong)((int)uVar8 + 2);
LAB_00103c12:
        if (-1 < iVar7) {
          uVar4 = (int)uVar8 - 1;
          uVar8 = 7;
          if (iVar7 <= (int)uVar4) {
            uVar8 = 7;
            do {
              *(undefined2 *)((long)local_38 + uVar8 * 2) =
                   *(undefined2 *)((long)local_38 + (ulong)uVar4 * 2);
              uVar8 = uVar8 - 1;
              uVar4 = uVar4 - 1;
            } while (iVar7 <= (int)uVar4);
          }
          if (iVar7 <= (int)uVar8) {
            do {
              iVar2 = (int)uVar8;
              *(undefined2 *)((long)local_38 + (uVar8 & 0xffffffff) * 2) = 0;
              uVar8 = (ulong)(iVar2 - 1);
            } while (iVar7 < iVar2);
          }
        }
        ip->addr[0] = local_38[0] >> 0x10 | local_38[0] << 0x10;
        ip->addr[1] = local_38[1] >> 0x10 | local_38[1] << 0x10;
        ip->addr[2] = local_38[2] >> 0x10 | local_38[2] << 0x10;
        ip->addr[3] = local_38[3] >> 0x10 | local_38[3] << 0x10;
        iVar2 = 0;
      }
      goto LAB_00103c77;
    }
    a = (char *)pbVar6;
    if (*pbVar6 == 0) goto LAB_00103c77;
  }
  if (uVar8 == 8) goto LAB_00103c77;
  *(short *)((long)local_38 + uVar8 * 2) = (short)iVar3;
  uVar8 = uVar8 + 1;
  pbVar6 = (byte *)a;
  goto LAB_00103b03;
}

Assistant:

int lrtr_ipv6_str_to_addr(const char *a, struct lrtr_ipv6_addr *ip)
{
	uint32_t *o = ip->addr;
	uint16_t words[8];
	int i, j, k, l, hfil;
	const char *start;

	if (a[0] == ':') { /* Leading :: */
		if (a[1] != ':')
			return -1;
		a++;
	}
	hfil = -1;
	i = 0;
	while (*a) {
		if (*a == ':') { /* :: */
			if (hfil >= 0)
				return -1;
			hfil = i;
			a++;
			continue;
		}
		j = 0;
		l = 0;
		start = a;
		for (;;) {
			if (*a >= '0' && *a <= '9')
				k = *a++ - '0';
			else if (*a >= 'A' && *a <= 'F')
				k = *a++ - 'A' + 10;
			else if (*a >= 'a' && *a <= 'f')
				k = *a++ - 'a' + 10;
			else
				break;
			j = (j << 4) + k;
			if (j >= 0x10000 || ++l > 4)
				return -1;
		}
		if (*a == ':' && a[1]) {
			a++;
		} else if (*a == '.' && (i == 6 || (i < 6 && hfil >= 0))) { /* Embedded IPv4 address */
			struct lrtr_ipv4_addr addr4;

			if (lrtr_ipv4_str_to_addr(start, &addr4) == -1)
				return -1;
			words[i++] = addr4.addr >> 16;
			words[i++] = addr4.addr;
			break;
		} else if (*a) {
			return -1;
		}
		if (i >= 8)
			return -1;
		words[i++] = j;
	}

	/* Replace :: with an appropriate quantity of zeros */
	if (hfil >= 0) {
		j = 8 - i;
		for (i = 7; i - j >= hfil; i--)
			words[i] = words[i - j];
		for (; i >= hfil; i--)
			words[i] = 0;
	}

	/* Convert the address to lrtr_ip_addr format */
	for (i = 0; i < 4; i++)
		o[i] = (words[2 * i] << 16) | words[2 * i + 1];
	return 0;
}